

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
          (CWriter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          char (*u) [13],OpenBrace *args)

{
  size_t size;
  
  anon_unknown_0::CWriter::WriteData((CWriter *)this,(t->_M_dataplus)._M_p,t->_M_string_length);
  size = strlen(*u);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*u,size);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }